

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

array_container_t * array_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint16_t *puVar3;
  int32_t n_runs;
  long lVar4;
  array_container_t *paVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint16_t uVar10;
  
  lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
    iVar7 = arr->n_runs;
    lVar4 = (long)iVar7;
    if (0 < lVar4) {
      lVar6 = 0;
      do {
        iVar7 = iVar7 + (uint)arr->runs[lVar6].length;
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  else {
    iVar7 = _avx2_run_container_cardinality(arr);
  }
  paVar5 = array_container_create_given_capacity(iVar7);
  paVar5->cardinality = 0;
  iVar7 = arr->n_runs;
  if (0 < (long)iVar7) {
    prVar2 = arr->runs;
    puVar3 = paVar5->array;
    lVar4 = 0;
    lVar6 = 0;
    do {
      uVar10 = prVar2[lVar4].value;
      uVar1 = prVar2[lVar4].length;
      iVar8 = (int)lVar6;
      lVar6 = (long)iVar8;
      uVar9 = 0;
      do {
        puVar3[lVar6] = uVar10;
        lVar6 = lVar6 + 1;
        uVar9 = uVar9 - 1;
        uVar10 = uVar10 + 1;
      } while (~(uint)uVar1 != uVar9);
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar7);
    paVar5->cardinality = iVar8 - uVar9;
  }
  return paVar5;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}